

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processQueryCommand(CoreBroker *this,ActionMessage *cmd)

{
  bool bVar1;
  action_t aVar2;
  route_id rVar3;
  mapped_type *this_00;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  ActionMessage *in_stack_000000b8;
  CoreBroker *in_stack_000000c0;
  ActionMessage *in_stack_00000168;
  CoreBroker *in_stack_00000170;
  ActionMessage *in_stack_00000978;
  CoreBroker *in_stack_00000980;
  value_type *in_stack_ffffffffffffff58;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff60;
  ActionMessage *in_stack_ffffffffffffff68;
  CoreBroker *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ActionMessage *in_stack_ffffffffffffff98;
  SimpleQueue<helics::ActionMessage,_std::mutex> *in_stack_ffffffffffffffa0;
  
  aVar2 = ActionMessage::action(in_RSI);
  if (aVar2 == cmd_set_global) {
    if (((in_RDI->super_BrokerBase).field_0x294 & 1) != 0) {
      ActionMessage::getString_abi_cxx11_
                (in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      SmallBuffer::to_string((SmallBuffer *)0x5d62cc);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffa0,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff98,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      this_00 = CLI::std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(this_00);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
      return;
    }
    bVar1 = GlobalBrokerId::isValid(&(in_RDI->super_BrokerBase).global_broker_id_local);
    if ((bVar1) &&
       (bVar1 = GlobalBrokerId::operator!=
                          (&(in_RDI->super_BrokerBase).global_broker_id_local,(GlobalBrokerId)0x0),
       bVar1)) {
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,in_RSI);
      return;
    }
    gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::push<helics::ActionMessage&>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    return;
  }
  if (aVar2 == cmd_query_reply) {
LAB_005d61f5:
    bVar1 = GlobalFederateId::operator==
                      (&in_RSI->dest_id,
                       (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    if (!bVar1) {
      rVar3 = getRoute(in_stack_ffffffffffffff78,(GlobalFederateId)(BaseType)in_RDI);
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)rVar3.rid,in_RSI);
      return;
    }
    processQueryResponse(in_stack_000000c0,in_stack_000000b8);
    return;
  }
  if (aVar2 == cmd_query) {
LAB_005d61de:
    processQuery(in_stack_00000980,in_stack_00000978);
  }
  else {
    if (aVar2 != cmd_broker_query) {
      if (aVar2 == cmd_query_ordered) goto LAB_005d61de;
      if (aVar2 != cmd_broker_query_ordered) {
        if (aVar2 != cmd_query_reply_ordered) {
          return;
        }
        goto LAB_005d61f5;
      }
    }
    if (((in_RDI->super_BrokerBase).field_0x295 & 1) == 0) {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      bVar1 = GlobalFederateId::operator==
                        (&in_RSI->dest_id,
                         (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      if ((bVar1) ||
         ((((in_RDI->super_BrokerBase).field_0x294 & 1) != 0 &&
          (bVar1 = GlobalFederateId::operator==(&in_RSI->dest_id,(GlobalBrokerId)0x0), bVar1)))) {
        processLocalQuery(in_stack_00000170,in_stack_00000168);
      }
      else {
        routeMessage(in_RDI,(ActionMessage *)in_stack_ffffffffffffff78);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::processQueryCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_BROKER_QUERY:
        case CMD_BROKER_QUERY_ORDERED:
            if (!connectionEstablished) {
                earlyMessages.push_back(std::move(cmd));
                break;
            }
            if (cmd.dest_id == global_broker_id_local ||
                (isRootc && cmd.dest_id == parent_broker_id)) {
                processLocalQuery(cmd);
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_QUERY:
        case CMD_QUERY_ORDERED:
            processQuery(cmd);
            break;
        case CMD_QUERY_REPLY:
        case CMD_QUERY_REPLY_ORDERED:
            if (cmd.dest_id == global_broker_id_local) {
                processQueryResponse(cmd);
            } else {
                transmit(getRoute(cmd.dest_id), cmd);
            }
            break;
        case CMD_SET_GLOBAL:
            if (isRootc) {
                global_values[std::string(cmd.payload.to_string())] = cmd.getString(0);
            } else {
                if ((global_broker_id_local.isValid()) &&
                    (global_broker_id_local != parent_broker_id)) {
                    transmit(parent_route_id, cmd);
                } else {
                    // delay the response if we are not fully registered yet
                    delayTransmitQueue.push(cmd);
                }
            }
            break;
        default:
            break;
    }
}